

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

shared_ptr<SchemePort>
get_output_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *l,string *proc,size_t skip)

{
  _List_node_base *p_Var1;
  eval_error *this;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<SchemePort> sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2> *)l,
             &current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>);
  _Var2._M_pi = extraout_RDX;
  if (in_RCX < (proc->field_2)._M_allocated_capacity) {
    std::next<std::_List_const_iterator<std::shared_ptr<SchemeObject>>>
              ((_List_node_base *)(proc->_M_dataplus)._M_p,in_RCX);
    std::dynamic_pointer_cast<SchemePort,SchemeObject>((shared_ptr<SchemeObject> *)&bStack_48);
    std::__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2> *)l,
               (__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2> *)&bStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_48._M_string_length);
    _Var2._M_pi = extraout_RDX_00;
  }
  p_Var1 = (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if ((p_Var1 != (_List_node_base *)0x0) && (p_Var1[2]._M_next != (_List_node_base *)0x0)) {
    sVar3.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
    ;
    sVar3.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)l;
    return (shared_ptr<SchemePort>)sVar3.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (eval_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)skip,
                 ": bad port");
  eval_error::runtime_error(this,&bStack_48);
  __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_output_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc, size_t skip)
{
    auto port = current_output_port;
    if(l.size() > skip)
        port = std::dynamic_pointer_cast<SchemePort>(*next(l.begin(), skip));
    if(!port || !port->output_stream)
        throw eval_error(proc + ": bad port");
    return port;
}